

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

unsigned_long __thiscall CTPNStmWhileBase::get_control_flow(CTPNStmWhileBase *this,int warn)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  CTcConstVal *this_00;
  int in_ESI;
  CTPNStmBase *in_RDI;
  unsigned_long flags;
  CTcConstVal *in_stack_ffffffffffffffe0;
  
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26fb6f);
  if (iVar1 != 0) {
    (*((in_RDI[1].next_stm_)->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[1])();
    iVar1 = CTcConstVal::get_val_bool(in_stack_ffffffffffffffe0);
    if ((((iVar1 == 0) && (in_RDI[1].file_ != (CTcTokFileDesc *)0x0)) &&
        (iVar1 = (**(code **)(*(long *)in_RDI[1].file_ + 0xe8))(), iVar1 == 0)) &&
       (iVar1 = CTcParser::get_syntax_only(G_prs), iVar1 != 0)) {
      if (in_ESI != 0) {
        iVar1 = (*((in_RDI[1].next_stm_)->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
                  _vptr_CTcPrsNodeBase[1])();
        iVar1 = CTcConstVal::is_ctc((CTcConstVal *)CONCAT44(extraout_var,iVar1));
        if (iVar1 == 0) {
          CTPNStmBase::log_warning(in_RDI,0x2b41);
        }
      }
      return 1;
    }
  }
  if (in_RDI[1].file_ == (CTcTokFileDesc *)0x0) {
    uVar2 = 0;
  }
  else {
    uVar2 = (**(code **)(*(long *)in_RDI[1].file_ + 0xe0))(in_RDI[1].file_,in_ESI);
  }
  this_00 = (CTcConstVal *)(uVar2 & 0xfffffffffffffffe);
  if ((uVar2 & 0x20) != 0) {
    this_00 = (CTcConstVal *)((ulong)this_00 | 1);
  }
  iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26fc70);
  if (iVar1 != 0) {
    iVar1 = CTcPrsNodeBase::is_const((CTcPrsNodeBase *)0x26fc82);
    if (iVar1 == 0) goto LAB_0026fcb0;
    (*((in_RDI[1].next_stm_)->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
      _vptr_CTcPrsNodeBase[1])();
    iVar1 = CTcConstVal::get_val_bool(this_00);
    if (iVar1 != 0) goto LAB_0026fcb0;
  }
  this_00 = (CTcConstVal *)((ulong)this_00 | 1);
LAB_0026fcb0:
  return (ulong)this_00 & 0xffffffffffffff9f;
}

Assistant:

unsigned long CTPNStmWhileBase::get_control_flow(int warn) const
{
    unsigned long flags;

    /*
     *   If we have a condition with a constant false value, and we have a
     *   non-empty body, and the body isn't reachable via a label, warn
     *   about the unreachable code 
     */
    if (cond_expr_->is_const()
        && !cond_expr_->get_const_val()->get_val_bool()
        && body_stm_ != 0
        && !body_stm_->has_code_label()
        && G_prs->get_syntax_only())
    {
        /* log a warning if desired */
        if (warn && !cond_expr_->get_const_val()->is_ctc())
            log_warning(TCERR_WHILE_COND_FALSE);

        /* this will simply continue to the next statement */
        return TCPRS_FLOW_NEXT;
    }

    /* check for a body */
    if (body_stm_ != 0)
    {
        /* determine how our body can exit */
        flags = body_stm_->get_control_flow(warn);
    }
    else
    {
        /* 
         *   We have no body, so it's entirely up to the loop - we'll
         *   evaluate those parameters below, but for now clear all flags 
         */
        flags = 0;
    }

    /* 
     *   ignore any 'next' flag that comes out of the body, because 'next'
     *   from the last statement in the body actually takes us back to the
     *   top of the loop 
     */
    flags &= ~TCPRS_FLOW_NEXT;

    /* 
     *   if there's a 'break' in the body, we can continue to the next
     *   statement, since a break in the body takes us to the statement
     *   after the 'for' 
     */
    if ((flags & TCPRS_FLOW_BREAK) != 0)
        flags |= TCPRS_FLOW_NEXT;

    /* 
     *   if the condition is a constant false value, or has a non-constant
     *   value, assume that the condition can possibly become false and
     *   hence that the loop can exit, and hence that the next statement
     *   is reachable 
     */
    if (!cond_expr_->is_const()
        || (cond_expr_->is_const()
            && !cond_expr_->get_const_val()->get_val_bool()))
        flags |= TCPRS_FLOW_NEXT;

    /* 
     *   clear the 'break' and 'continue' flags, since we capture them in
     *   our own scope - if our child breaks or continues, it won't affect
     *   the loop's container 
     */
    flags &= ~(TCPRS_FLOW_BREAK | TCPRS_FLOW_CONT);

    /* return the flags */
    return flags;
}